

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

seed_t lest::seed(text *opt,text *arg)

{
  pointer pcVar1;
  size_type *__s;
  size_t __n;
  _Alloc_hider _Var2;
  int iVar3;
  size_type sVar4;
  void *pvVar5;
  seed_t sVar6;
  long lVar7;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  bool bVar10;
  size_type *local_f8;
  size_t local_f0;
  size_type local_e8;
  undefined8 uStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50 [2];
  long local_40 [2];
  
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (arg,"time");
  if (iVar3 == 0) {
    sVar6 = time((time_t *)0x0);
    return sVar6;
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  pcVar1 = (arg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar1,pcVar1 + arg->_M_string_length);
  local_f8 = &local_e8;
  local_e8 = 0x3736353433323130;
  local_f0 = 10;
  uStack_e0 = CONCAT53(uStack_e0._3_5_,0x3938);
  bVar10 = false;
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_of(&local_d8,(char *)local_f8,0,10);
  _Var2._M_p = local_d8._M_dataplus._M_p;
  __n = local_f0;
  __s = local_f8;
  if (sVar4 != 0xffffffffffffffff) {
    if (local_d8._M_string_length == 0) {
      bVar10 = true;
    }
    else if (local_f0 == 0) {
      bVar10 = false;
    }
    else {
      sVar4 = 0;
      local_b8 = opt;
      do {
        pvVar5 = memchr(__s,(int)_Var2._M_p[sVar4],__n);
        if (pvVar5 == (void *)0x0) goto LAB_00109120;
        sVar4 = sVar4 + 1;
      } while (local_d8._M_string_length != sVar4);
      sVar4 = 0xffffffffffffffff;
LAB_00109120:
      bVar10 = sVar4 == 0xffffffffffffffff;
      opt = local_b8;
    }
  }
  if (__s != &local_e8) {
    operator_delete(__s,local_e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar10) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_b0,"expecting \'time\' or positive number with option \'",opt);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_b0,"\', got \'");
    local_90._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar9 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar9) {
      local_90.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_90._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    std::operator+(&local_70,&local_90,arg);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_70,"\' (try option --help)");
    local_f8 = (size_type *)(pbVar8->_M_dataplus)._M_p;
    paVar9 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8 == paVar9) {
      local_e8 = paVar9->_M_allocated_capacity;
      uStack_e0 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_f8 = &local_e8;
    }
    else {
      local_e8 = paVar9->_M_allocated_capacity;
    }
    local_f0 = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    std::runtime_error::runtime_error(this,(string *)&local_f8);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = (arg->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + arg->_M_string_length);
  lVar7 = strtol((char *)local_50[0],(char **)0x0,10);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return (long)(int)lVar7;
}

Assistant:

inline seed_t seed( text opt, text arg )
{
    // std::time_t: implementation dependent

    if ( arg == "time" )
        return static_cast<seed_t>( time( lest_nullptr ) );

    if ( is_number( arg ) )
        return static_cast<seed_t>( lest::stoi( arg ) );

    throw std::runtime_error( "expecting 'time' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}